

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

MeshAttributeCornerTable * __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
GetAttributeCornerTable
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          int att_id)

{
  pointer pAVar1;
  long lVar2;
  MeshAttributeCornerTable *pMVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  pAVar1 = (this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->attribute_data_).
                super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  if (lVar2 == 0) {
    return (MeshAttributeCornerTable *)0x0;
  }
  uVar4 = (lVar2 >> 4) * -0x79435e50d79435e5;
  uVar5 = 1;
  uVar6 = 0;
  do {
    if (pAVar1[uVar6].attribute_index == att_id) {
      pMVar3 = (MeshAttributeCornerTable *)0x0;
      if (pAVar1[uVar6].is_connectivity_used != false) {
        pMVar3 = &pAVar1[uVar6].connectivity_data;
      }
      return pMVar3;
    }
    uVar6 = (ulong)uVar5;
    uVar5 = uVar5 + 1;
  } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  return (MeshAttributeCornerTable *)0x0;
}

Assistant:

const MeshAttributeCornerTable *
MeshEdgebreakerEncoderImpl<TraversalEncoder>::GetAttributeCornerTable(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    if (attribute_data_[i].attribute_index == att_id) {
      if (attribute_data_[i].is_connectivity_used) {
        return &attribute_data_[i].connectivity_data;
      }
      return nullptr;
    }
  }
  return nullptr;
}